

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O2

void Search::iterative_deepening(position *p,U16 depth,bool silent)

{
  uint uVar1;
  position *ppVar2;
  int iVar3;
  Score SVar4;
  ulong uVar5;
  Score *alpha;
  undefined7 in_register_00000011;
  ulong uVar6;
  int iVar7;
  undefined6 in_register_00000032;
  node *stack_00;
  ulong uVar8;
  Score SVar9;
  int iVar10;
  bool bVar11;
  long lVar12;
  Score SVar13;
  U16 local_102e;
  undefined4 local_102c;
  Score local_1028;
  Score local_1024;
  Score eval;
  uint local_101c;
  uint local_1018;
  int local_1014;
  position *local_1010;
  undefined4 local_1008;
  uint local_1004;
  Rootmoves *local_1000;
  ulong local_ff8;
  undefined8 local_ff0;
  Move pv [68];
  node stack [68];
  
  local_1008 = (undefined4)CONCAT71(in_register_00000011,silent);
  uVar6 = CONCAT62(in_register_00000032,depth) & 0xffffffff;
  eval = ninf;
  uVar1 = (p->params).fixed_depth;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  lVar12 = 0;
  local_1010 = p;
  do {
    node::node((node *)((long)stack[0].killers + lVar12 + -0x28));
    lVar12 = lVar12 + 0x38;
  } while (lVar12 != 0xee0);
  lVar12 = 2;
  do {
    *(undefined2 *)((long)pv + lVar12 + -2) = 0;
    (&pv[0].f)[lVar12] = '\x11';
    lVar12 = lVar12 + 3;
  } while (lVar12 != 0xce);
  stack[2].pv = pv;
  local_101c = (uint)uVar6 & 0xffff;
  local_1000 = &local_1010->root_moves;
  iVar7 = 0xd8f0;
  local_1014 = (int)CONCAT62((int6)((ulong)local_1000 >> 0x10),10000);
  uVar6 = CONCAT62((int6)(uVar6 >> 0x10),0x41);
  SVar4 = ninf;
  uVar5 = (ulong)local_1010->thread_id;
  do {
    do {
      if ((local_101c <= (uint)uVar5) || (UCI_SIGNALS.stop != false)) goto LAB_00121834;
      stack[2].ply = 0;
      stack[1].ply = 0;
      stack[0].ply = 0;
      hashHits = 0;
      local_1018 = (uint)uVar5 + 1;
      uVar8 = 0;
      local_1004 = local_1018 & 0xffff;
      bVar11 = false;
      local_ff0 = uVar5;
      while( true ) {
        ppVar2 = local_1010;
        if ((int)local_ff0 == 0) {
          local_102c = (undefined4)uVar8;
        }
        else {
          iVar7 = SVar4 + 0xffffffdf;
          if ((short)(SVar4 + 0xffffffdf) < -9999) {
            iVar7 = 0xd8f0;
          }
          iVar10 = SVar4 + 0x21;
          iVar3 = 10000;
          if ((short)iVar10 < 10000) {
            iVar3 = iVar10;
          }
          local_1014 = (int)uVar6 + iVar3;
          if ((uVar8 & 1) == 0) {
            local_1014 = iVar10;
          }
          if (9999 < (short)local_1014) {
            local_1014 = 10000;
          }
          if ((bVar11) && (iVar7 = iVar7 - (int)uVar6, (short)iVar7 < -9999)) {
            iVar7 = 0xd8f0;
          }
          local_102c = 0;
          bVar11 = false;
        }
        selDepth = 0;
        SVar13 = (Score)(short)iVar7;
        SVar9 = (Score)(short)local_1014;
        local_ff8 = uVar6;
        SVar4 = search<(Nodetype)0>(local_1010,(short)iVar7,(short)local_1014,(U16)local_1004,
                                    stack + 2);
        stack_00 = (node *)(ppVar2->root_moves).
                           super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                           super__Vector_impl_data._M_start;
        eval = SVar4;
        std::
        __stable_sort<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (stack_00,(ppVar2->root_moves).
                            super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                            super__Vector_impl_data._M_finish);
        uVar6 = local_ff8;
        uVar1 = local_1018;
        if ((UCI_SIGNALS.stop != false) || ((SVar13 < SVar4 && (SVar4 < SVar9)))) break;
        alpha = &local_1024;
        local_102e = (U16)local_1018;
        local_1028 = SVar9;
        local_1024 = SVar13;
        readout_pv(stack_00,local_1000,&eval,alpha,&local_1028,&local_102e);
        bVar11 = (bool)(SVar4 <= SVar13 | bVar11);
        uVar6 = (ulong)(uint)((int)CONCAT62((int6)((local_ff8 & 0xffffffff) >> 0x10),
                                            (short)(local_ff8 & 0xffffffff) / 4) + (int)local_ff8);
        uVar8 = CONCAT71((int7)((ulong)alpha >> 8),SVar13 < SVar4 | (byte)local_102c) & 0xffffffff;
      }
      uVar8 = (ulong)local_1018;
      uVar5 = uVar8;
    } while ((local_1010->thread_id != 0) || (uVar5 = (ulong)local_1018, UCI_SIGNALS.stop != false))
    ;
    if ((char)local_1008 == '\0') {
      local_102e = (U16)local_1018;
      local_1028 = SVar9;
      local_1024 = SVar13;
      readout_pv((node *)local_1010,local_1000,&eval,&local_1024,&local_1028,&local_102e);
    }
    uVar5 = uVar8;
  } while (uVar1 != local_101c);
  UCI_SIGNALS.stop = true;
LAB_00121834:
  lVar12 = 0xea8;
  do {
    node::~node((node *)((long)stack[0].killers + lVar12 + -0x28));
    lVar12 = lVar12 + -0x38;
  } while (lVar12 != -0x38);
  return;
}

Assistant:

void Search::iterative_deepening(position& p, U16 depth, bool silent) {
	int16 alpha = ninf;
	int16 beta = inf;
	int16 delta = 65;
	int16 smallDelta = 33;
	Score eval = ninf;


	if (p.params.fixed_depth > 0) {
		depth = p.params.fixed_depth;
	}

	const unsigned stack_size = 64 + 4;
	node stack[stack_size];
	Move pv[Depth::MAX_PLY + 4];

	(stack + 2)->pv = pv;


	// Main iterative deepening loop
	for (unsigned id = 1 + p.id(); id <= depth; ++id) {

		if (UCI_SIGNALS.stop)
			break;

		(stack+0)->ply = (stack + 1)->ply = (stack + 2)->ply = 0;

		auto failLow = false;
		auto failHigh = false;
		hashHits = 0;

		// 1. aspiration window search
		while (true) {
			if (id >= 2) {
				alpha = std::max(int16(eval - smallDelta), int16(ninf));
				beta = std::min(int16(eval + smallDelta), int16(inf));
				if (failLow) {
					beta = std::min(int16(beta + delta), int16(inf));
					failLow = false;
				}
				if (failHigh) {
					alpha = std::max(int16(alpha - delta), int16(ninf));
					failHigh = false;
				}
			}

			selDepth = 0;
			eval = search<root>(p, alpha, beta, id, stack + 2);

			// bring the best move to the front of the root move array
			std::stable_sort(p.root_moves.begin(), p.root_moves.end());


			if (UCI_SIGNALS.stop)
				break;

			if ((eval <= alpha || eval >= beta))
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (eval <= alpha) {
				delta += delta / 4;
				failHigh = true;
			}
			else if (eval >= beta) {
				delta += delta / 4;
				failLow = true;
			}
			else break;
		}


		// 2. Print PV to UI
		if (main_thread(p) && !UCI_SIGNALS.stop) {

			if (!silent)
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (id == depth) {
				UCI_SIGNALS.stop = true;
				break;
			}
		}
	}
}